

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O1

void prsclin(prscxdef *ctx,uint curfr,lindef *lin,int tellsrc,uchar *saved_loc)

{
  ushort *puVar1;
  ushort uVar2;
  emtcxdef *peVar3;
  ushort uVar4;
  int iVar5;
  uint16_t tmp;
  uchar cur [20];
  uchar auStack_48 [32];
  
  if (tellsrc != 0) {
    dbgclin(ctx->prscxtok,ctx->prscxemt->emtcxobj,(uint)ctx->prscxemt->emtcxofs);
  }
  emtres(ctx->prscxemt,1);
  peVar3 = ctx->prscxemt;
  uVar2 = peVar3->emtcxofs;
  peVar3->emtcxofs = uVar2 + 1;
  peVar3->emtcxptr[uVar2] = 'N';
  emtres(ctx->prscxemt,1);
  uVar4 = lin->linlln;
  peVar3 = ctx->prscxemt;
  uVar2 = peVar3->emtcxofs;
  peVar3->emtcxofs = uVar2 + 1;
  peVar3->emtcxptr[uVar2] = (char)uVar4 + '\x04';
  emtres(ctx->prscxemt,2);
  *(short *)(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs) = (short)curfr;
  puVar1 = &ctx->prscxemt->emtcxofs;
  *puVar1 = *puVar1 + 2;
  emtres(ctx->prscxemt,1);
  iVar5 = lin->linid;
  peVar3 = ctx->prscxemt;
  uVar2 = peVar3->emtcxofs;
  peVar3->emtcxofs = uVar2 + 1;
  peVar3->emtcxptr[uVar2] = (uchar)iVar5;
  emtres(ctx->prscxemt,lin->linlln);
  if (saved_loc == (uchar *)0x0) {
    (*lin->linglop)(lin,ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs);
    puVar1 = &ctx->prscxemt->emtcxofs;
    *puVar1 = *puVar1 + lin->linlln;
  }
  else {
    memcpy(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs,saved_loc,(ulong)lin->linlln);
    (*lin->linglop)(lin,auStack_48);
    uVar2 = lin->linlln;
    iVar5 = bcmp(auStack_48,saved_loc,(ulong)uVar2);
    puVar1 = &ctx->prscxemt->emtcxofs;
    *puVar1 = *puVar1 + uVar2;
    if (iVar5 != 0) {
      return;
    }
  }
  puVar1 = &ctx->prscxtok->tokcxlin->linflg;
  *puVar1 = *puVar1 | 4;
  return;
}

Assistant:

static void prsclin(prscxdef *ctx, uint curfr, lindef *lin, int tellsrc,
                    const uchar *saved_loc)
{
    int diff = FALSE;

    /* tell the line source the location of the line */
    if (tellsrc)
    {
        dbgclin(ctx->prscxtok, ctx->prscxemt->emtcxobj,
                (uint)ctx->prscxemt->emtcxofs);
    }
        
    /* emit a LINE instruction, noting location and frame */
    emtop(ctx->prscxemt, OPCLINE);
    emtbyte(ctx->prscxemt, lin->linlln + 4);       /* note length of record */
    emtint2(ctx->prscxemt, curfr);           /* store current frame pointer */
    emtbyte(ctx->prscxemt, lin->linid);              /* save line source ID */
    emtres(ctx->prscxemt, lin->linlln);        /* make room for source part */

    /* use the saved location, or the current location if there isn't one */
    if (saved_loc != 0)
    {
        uchar cur[LINLLNMAX];
        
        /* use the saved location */
        memcpy(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs,
               saved_loc, lin->linlln);

        /* check to see if it's different from the current location */
        linglop(lin, cur);
        diff = memcmp(cur, saved_loc, lin->linlln);
    }
    else
    {
        /* no saved location - use the current location from the lindef */
        linglop(lin, ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs);
    }

    /* advance the output pointer */
    ctx->prscxemt->emtcxofs += lin->linlln;

    /* 
     *   indicate in line source that we've generated a debug record, as long
     *   as the generated location isn't different from current location (if
     *   it is, don't mark this line as used yet) 
     */
    if (!diff)
        ctx->prscxtok->tokcxlin->linflg |= LINFDBG;
}